

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

bool __thiscall
Assimp::X3DExporter::CheckAndExport_Light(X3DExporter *this,aiNode *pNode,size_t pTabLevel)

{
  char *__s;
  pointer pcVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  aiLightSourceType aVar6;
  aiLight *paVar7;
  size_t sVar8;
  int iVar9;
  aiMatrix4x4t<float> *paVar10;
  _Node *p_Var11;
  runtime_error *this_00;
  bool bVar12;
  X3DExporter *pXVar13;
  aiLight **ppaVar14;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  anon_class_16_2_65aab299 Vec3ToAttrList;
  undefined1 local_190 [32];
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  _Base_ptr local_140;
  float local_138;
  undefined1 local_130 [24];
  undefined1 local_118 [32];
  X3DExporter *local_f8;
  size_t local_f0;
  anon_class_16_2_65aab299 local_e8;
  aiVector3D local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  aiVector3D local_40;
  
  local_130._0_8_ = local_130;
  local_130._16_8_ = (pointer)0x0;
  uVar5 = (pNode->mName).length;
  local_130._8_8_ = local_130._0_8_;
  local_e8.this = this;
  local_e8.attr_list =
       (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> *)
       local_130._0_8_;
  if (((ulong)uVar5 != 0) && (this->mScene->mNumLights != 0)) {
    ppaVar14 = this->mScene->mLights;
    local_f8 = this;
    local_f0 = pTabLevel;
    do {
      paVar7 = *ppaVar14;
      if (uVar5 == (paVar7->mName).length) {
        __s = (paVar7->mName).data;
        pXVar13 = (X3DExporter *)__s;
        iVar9 = bcmp((pNode->mName).data,__s,(ulong)uVar5);
        if (iVar9 == 0) goto LAB_00357b4c;
      }
      ppaVar14 = ppaVar14 + 1;
    } while( true );
  }
  bVar12 = false;
LAB_003584a5:
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear((_List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            *)local_130);
  return bVar12;
LAB_00357b4c:
  Matrix_GlobalToCurrent((aiMatrix4x4 *)local_190,pXVar13,pNode);
  paVar10 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_190);
  local_78 = ZEXT416((uint)paVar10->a1);
  local_88 = ZEXT416((uint)paVar10->a2);
  local_68 = ZEXT416((uint)paVar10->a3);
  local_58 = ZEXT416((uint)paVar10->a4);
  local_b8 = ZEXT416((uint)paVar10->b1);
  local_c8 = ZEXT416((uint)paVar10->b2);
  local_a8 = ZEXT416((uint)paVar10->b3);
  local_98 = ZEXT416((uint)paVar10->b4);
  local_14c = paVar10->c1;
  local_148 = paVar10->c2;
  local_150 = paVar10->c3;
  local_144 = paVar10->c4;
  pcVar1 = local_190 + 0x10;
  local_190._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"DEF","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,__s,(allocator<char> *)local_118);
  p_Var11 = std::__cxx11::
            list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            ::_M_create_node<Assimp::X3DExporter::SAttribute>
                      ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                        *)local_130,(SAttribute *)local_190);
  std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
  local_130._16_8_ = local_130._16_8_ + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p != &local_160) {
    operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
  }
  if ((pointer)local_190._0_8_ != pcVar1) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  local_190._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"global","");
  local_170._M_p = (pointer)&local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"true","");
  p_Var11 = std::__cxx11::
            list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            ::_M_create_node<Assimp::X3DExporter::SAttribute>
                      ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                        *)local_130,(SAttribute *)local_190);
  std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
  local_130._16_8_ = local_130._16_8_ + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p != &local_160) {
    operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
  }
  if ((pointer)local_190._0_8_ != pcVar1) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  pXVar13 = (X3DExporter *)local_190;
  local_190._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar13,"ambientIntensity","");
  fVar2 = (paVar7->mColorAmbient).r;
  fVar3 = (paVar7->mColorAmbient).g;
  fVar4 = (paVar7->mColorAmbient).b;
  AttrHelper_FloatToAttrList
            (pXVar13,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                      *)local_130,(string *)local_190,
             SQRT(fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3),0.0);
  if ((pointer)local_190._0_8_ != pcVar1) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  pXVar13 = (X3DExporter *)local_190;
  local_190._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar13,"color","");
  local_118._0_8_ = (pointer)0x3f8000003f800000;
  local_118._8_4_ = 0x3f800000;
  AttrHelper_Color3ToAttrList
            (pXVar13,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                      *)local_130,(string *)local_190,&paVar7->mColorDiffuse,(aiColor3D *)local_118)
  ;
  if ((pointer)local_190._0_8_ != pcVar1) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  aVar6 = paVar7->mType;
  if (aVar6 == aiLightSource_DIRECTIONAL) {
    fVar2 = (paVar7->mDirection).x;
    fVar3 = (paVar7->mDirection).y;
    fVar4 = (paVar7->mDirection).z;
    local_118._8_4_ = local_144 + local_148 * fVar3 + local_14c * fVar2 + local_150 * fVar4;
    local_118._0_8_ =
         CONCAT44((float)local_98._0_4_ +
                  fVar4 * (float)local_a8._0_4_ +
                  fVar2 * (float)local_b8._0_4_ + fVar3 * (float)local_c8._0_4_,
                  (float)local_58._0_4_ +
                  fVar4 * (float)local_68._0_4_ +
                  fVar2 * (float)local_78._0_4_ + fVar3 * (float)local_88._0_4_);
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"direction","");
    local_140 = (_Base_ptr)0x0;
    local_138 = -1.0;
    CheckAndExport_Light::anon_class_16_2_65aab299::operator()
              (&local_e8,(string *)local_190,(aiVector3D *)local_118,(aiVector3D *)&local_140);
    sVar8 = local_f0;
    if ((pointer)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"DirectionalLight","");
    NodeHelper_OpenNode(local_f8,(string *)local_190,sVar8,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)local_130);
  }
  else if (aVar6 == aiLightSource_POINT) {
    local_118._8_4_ = paVar7->mAttenuationQuadratic;
    local_118._0_8_ = *(undefined8 *)&paVar7->mAttenuationConstant;
    fVar2 = (paVar7->mPosition).x;
    fVar3 = (paVar7->mPosition).y;
    fVar4 = (paVar7->mPosition).z;
    local_138 = local_144 + local_148 * fVar3 + local_14c * fVar2 + local_150 * fVar4;
    local_140 = (_Base_ptr)
                CONCAT44((float)local_98._0_4_ +
                         fVar4 * (float)local_a8._0_4_ +
                         fVar2 * (float)local_b8._0_4_ + fVar3 * (float)local_c8._0_4_,
                         (float)local_58._0_4_ +
                         fVar4 * (float)local_68._0_4_ +
                         fVar2 * (float)local_78._0_4_ + fVar3 * (float)local_88._0_4_);
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"attenuation","");
    local_d8.x = 1.0;
    local_d8.y = 0.0;
    local_d8.z = 0.0;
    CheckAndExport_Light::anon_class_16_2_65aab299::operator()
              (&local_e8,(string *)local_190,(aiVector3D *)local_118,&local_d8);
    sVar8 = local_f0;
    if ((pointer)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"location","");
    local_d8.x = 0.0;
    local_d8.y = 0.0;
    local_d8.z = 0.0;
    CheckAndExport_Light::anon_class_16_2_65aab299::operator()
              (&local_e8,(string *)local_190,(aiVector3D *)&local_140,&local_d8);
    if ((pointer)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"PointLight","");
    NodeHelper_OpenNode(local_f8,(string *)local_190,sVar8,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)local_130);
  }
  else {
    if (aVar6 != aiLightSource_SPOT) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<aiLightSourceType>((string *)local_118,paVar7->mType);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     "Unknown light type: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118)
      ;
      std::runtime_error::runtime_error(this_00,(string *)local_190);
      *(undefined ***)this_00 = &PTR__runtime_error_0080bf48;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_118._8_4_ = paVar7->mAttenuationQuadratic;
    local_118._0_8_ = *(undefined8 *)&paVar7->mAttenuationConstant;
    fVar2 = (paVar7->mPosition).x;
    fVar3 = (paVar7->mPosition).y;
    fVar4 = (paVar7->mPosition).z;
    local_140 = (_Base_ptr)
                CONCAT44(fVar4 * (float)local_a8._0_4_ +
                         fVar2 * (float)local_b8._0_4_ + fVar3 * (float)local_c8._0_4_ +
                         (float)local_98._0_4_,
                         fVar4 * (float)local_68._0_4_ +
                         fVar2 * (float)local_78._0_4_ + fVar3 * (float)local_88._0_4_ +
                         (float)local_58._0_4_);
    local_138 = fVar3 * local_148 + local_14c * fVar2 + local_150 * fVar4 + local_144;
    fVar2 = (paVar7->mDirection).x;
    fVar3 = (paVar7->mDirection).y;
    fVar4 = (paVar7->mDirection).z;
    local_d8.z = local_14c * fVar2 + local_148 * fVar3 + local_150 * fVar4 + local_144;
    local_d8.y = fVar4 * (float)local_a8._0_4_ +
                 fVar2 * (float)local_b8._0_4_ + fVar3 * (float)local_c8._0_4_ +
                 (float)local_98._0_4_;
    local_d8.x = fVar4 * (float)local_68._0_4_ +
                 fVar2 * (float)local_78._0_4_ + fVar3 * (float)local_88._0_4_ +
                 (float)local_58._0_4_;
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"attenuation","");
    local_40.x = 1.0;
    local_40.y = 0.0;
    local_40.z = 0.0;
    CheckAndExport_Light::anon_class_16_2_65aab299::operator()
              (&local_e8,(string *)local_190,(aiVector3D *)local_118,&local_40);
    if ((pointer)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"location","");
    local_40.x = 0.0;
    local_40.y = 0.0;
    local_40.z = 0.0;
    CheckAndExport_Light::anon_class_16_2_65aab299::operator()
              (&local_e8,(string *)local_190,(aiVector3D *)&local_140,&local_40);
    if ((pointer)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"direction","");
    local_40.x = 0.0;
    local_40.y = 0.0;
    local_40.z = -1.0;
    CheckAndExport_Light::anon_class_16_2_65aab299::operator()
              (&local_e8,(string *)local_190,&local_d8,&local_40);
    if ((pointer)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    pXVar13 = (X3DExporter *)local_190;
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)pXVar13,"beamWidth","");
    AttrHelper_FloatToAttrList
              (pXVar13,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                        *)local_130,(string *)local_190,paVar7->mAngleInnerCone,0.7854);
    if ((pointer)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    pXVar13 = (X3DExporter *)local_190;
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)pXVar13,"cutOffAngle","");
    AttrHelper_FloatToAttrList
              (pXVar13,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                        *)local_130,(string *)local_190,paVar7->mAngleOuterCone,1.570796);
    sVar8 = local_f0;
    if ((pointer)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"SpotLight","");
    NodeHelper_OpenNode(local_f8,(string *)local_190,sVar8,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)local_130);
  }
  if ((pointer)local_190._0_8_ != pcVar1) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  bVar12 = true;
  goto LAB_003584a5;
}

Assistant:

bool X3DExporter::CheckAndExport_Light(const aiNode& pNode, const size_t pTabLevel)
{
list<SAttribute> attr_list;

auto Vec3ToAttrList = [&](const string& pAttrName, const aiVector3D& pAttrValue, const aiVector3D& pAttrDefaultValue)
{
	string tstr;

	if(pAttrValue != pAttrDefaultValue)
	{
		AttrHelper_Vec3DArrToString(&pAttrValue, 1, tstr);
		attr_list.push_back({pAttrName, tstr});
	}
};

size_t idx_light;
bool found = false;

	// Name of the light source can not be empty.
	if(pNode.mName.length == 0) return false;

	// search for light with name like node has.
	for(idx_light = 0; mScene->mNumLights; idx_light++)
	{
		if(pNode.mName == mScene->mLights[idx_light]->mName)
		{
			found = true;
			break;
		}
	}

	if(!found) return false;

	// Light source is found.
	const aiLight& light = *mScene->mLights[idx_light];// Alias for conveniance.

	aiMatrix4x4 trafo_mat = Matrix_GlobalToCurrent(pNode).Inverse();

	attr_list.push_back({"DEF", light.mName.C_Str()});
	attr_list.push_back({"global", "true"});// "false" is not supported.
	// ambientIntensity="0" SFFloat [inputOutput]
	AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", aiVector3D(light.mColorAmbient.r, light.mColorAmbient.g, light.mColorAmbient.b).Length(), 0);
	// color="1 1 1"        SFColor [inputOutput]
	AttrHelper_Color3ToAttrList(attr_list, "color", light.mColorDiffuse, aiColor3D(1, 1, 1));

	switch(light.mType)
	{
		case aiLightSource_DIRECTIONAL:
			{
				aiVector3D direction = trafo_mat * light.mDirection;

				Vec3ToAttrList("direction", direction, aiVector3D(0, 0, -1));
				NodeHelper_OpenNode("DirectionalLight", pTabLevel, true, attr_list);
			}

			break;
		case aiLightSource_POINT:
			{
				aiVector3D attenuation(light.mAttenuationConstant, light.mAttenuationLinear, light.mAttenuationQuadratic);
				aiVector3D location = trafo_mat * light.mPosition;

				Vec3ToAttrList("attenuation", attenuation, aiVector3D(1, 0, 0));
				Vec3ToAttrList("location", location, aiVector3D(0, 0, 0));
				NodeHelper_OpenNode("PointLight", pTabLevel, true, attr_list);
			}

			break;
		case aiLightSource_SPOT:
			{
				aiVector3D attenuation(light.mAttenuationConstant, light.mAttenuationLinear, light.mAttenuationQuadratic);
				aiVector3D location = trafo_mat * light.mPosition;
				aiVector3D direction = trafo_mat * light.mDirection;

				Vec3ToAttrList("attenuation", attenuation, aiVector3D(1, 0, 0));
				Vec3ToAttrList("location", location, aiVector3D(0, 0, 0));
				Vec3ToAttrList("direction", direction, aiVector3D(0, 0, -1));
				AttrHelper_FloatToAttrList(attr_list, "beamWidth", light.mAngleInnerCone, 0.7854f);
				AttrHelper_FloatToAttrList(attr_list, "cutOffAngle", light.mAngleOuterCone, 1.570796f);
				NodeHelper_OpenNode("SpotLight", pTabLevel, true, attr_list);
			}

			break;
		default:
			throw DeadlyExportError("Unknown light type: " + to_string(light.mType));
	}// switch(light.mType)

	return true;
}